

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

Totals * __thiscall
Catch::Totals::delta(Totals *__return_storage_ptr__,Totals *this,Totals *prevTotals)

{
  long *plVar1;
  ulong uVar2;
  
  operator-(this,prevTotals);
  uVar2 = 0x28;
  if ((__return_storage_ptr__->assertions).failed == 0) {
    uVar2 = (ulong)((__return_storage_ptr__->assertions).failedButOk != 0) << 4 | 0x20;
  }
  plVar1 = (long *)((long)&__return_storage_ptr__->error + uVar2);
  *plVar1 = *plVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

Totals Totals::delta( Totals const& prevTotals ) const {
        Totals diff = *this - prevTotals;
        if( diff.assertions.failed > 0 )
            ++diff.testCases.failed;
        else if( diff.assertions.failedButOk > 0 )
            ++diff.testCases.failedButOk;
        else
            ++diff.testCases.passed;
        return diff;
    }